

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCapsuleShape.cpp
# Opt level: O1

void __thiscall
btCapsuleShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btCapsuleShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,int numVectors)

{
  undefined8 uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  float extraout_XMM0_Da;
  float fVar6;
  float extraout_XMM0_Da_00;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btScalar local_88 [2];
  undefined8 uStack_80;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  btScalar local_58;
  btScalar bStack_54;
  btScalar bStack_50;
  btScalar bStack_4c;
  undefined1 local_48 [16];
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  if (0 < numVectors) {
    local_58 = (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats
               [(*(int *)&(this->super_btConvexInternalShape).field_0x44 + 2) % 3];
    local_48 = ZEXT416((uint)local_58);
    lVar5 = 0;
    bStack_54 = local_58;
    bStack_50 = local_58;
    bStack_4c = local_58;
    do {
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      uStack_80 = 0;
      iVar2 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
      local_88[iVar2] =
           (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar2];
      local_68 = ZEXT416((uint)(*(float *)((long)vectors->m_floats + lVar5 + 8) *
                                (float)local_48._0_4_ + (float)uStack_80));
      uVar1 = *(undefined8 *)((long)vectors->m_floats + lVar5);
      local_78._4_4_ = local_88[1] + (float)((ulong)uVar1 >> 0x20) * bStack_54;
      local_78._0_4_ = local_88[0] + (float)uVar1 * local_58;
      fStack_70 = bStack_50 * 0.0 + 0.0;
      fStack_6c = bStack_4c * 0.0 + 0.0;
      (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xc])(this);
      uVar1 = *(undefined8 *)((long)vectors->m_floats + lVar5);
      fVar7 = (float)uVar1;
      fVar8 = (float)((ulong)uVar1 >> 0x20);
      fVar10 = (float)local_78._0_4_ - extraout_XMM0_Da * fVar7;
      fVar11 = (float)local_78._4_4_ - extraout_XMM0_Da * fVar8;
      fVar6 = *(float *)((long)vectors->m_floats + lVar5 + 8);
      fVar9 = (float)local_68._0_4_ - extraout_XMM0_Da * fVar6;
      fVar7 = fVar6 * fVar9 + fVar7 * fVar10 + fVar8 * fVar11;
      fVar6 = -1e+18;
      if (-1e+18 < fVar7) {
        auVar3._4_4_ = fVar11;
        auVar3._0_4_ = fVar10;
        auVar3._8_4_ = fVar9;
        auVar3._12_4_ = 0;
        *(undefined1 (*) [16])((long)supportVerticesOut->m_floats + lVar5) = auVar3;
        fVar6 = fVar7;
      }
      local_68._0_4_ = fVar6;
      local_88[0] = 0.0;
      local_88[1] = 0.0;
      uStack_80 = 0;
      iVar2 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
      local_88[iVar2] =
           -(this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar2];
      _local_78 = ZEXT416((uint)(*(float *)((long)vectors->m_floats + lVar5 + 8) *
                                 (float)local_48._0_4_ + (float)uStack_80));
      uVar1 = *(undefined8 *)((long)vectors->m_floats + lVar5);
      local_38 = local_88[0] + (float)uVar1 * local_58;
      fStack_34 = local_88[1] + (float)((ulong)uVar1 >> 0x20) * bStack_54;
      fStack_30 = bStack_50 * 0.0 + 0.0;
      fStack_2c = bStack_4c * 0.0 + 0.0;
      (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xc])(this);
      uVar1 = *(undefined8 *)((long)vectors->m_floats + lVar5);
      fVar7 = (float)uVar1;
      fVar8 = (float)((ulong)uVar1 >> 0x20);
      fVar10 = local_38 - extraout_XMM0_Da_00 * fVar7;
      fVar11 = fStack_34 - extraout_XMM0_Da_00 * fVar8;
      fVar6 = *(float *)((long)vectors->m_floats + lVar5 + 8);
      fVar9 = (float)local_78._0_4_ - extraout_XMM0_Da_00 * fVar6;
      if ((float)local_68._0_4_ < fVar6 * fVar9 + fVar7 * fVar10 + fVar8 * fVar11) {
        auVar4._4_4_ = fVar11;
        auVar4._0_4_ = fVar10;
        auVar4._8_4_ = fVar9;
        auVar4._12_4_ = 0;
        *(undefined1 (*) [16])((long)supportVerticesOut->m_floats + lVar5) = auVar4;
      }
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uint)numVectors << 4 != lVar5);
  }
  return;
}

Assistant:

void	btCapsuleShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
{

	
	btScalar radius = getRadius();

	for (int j=0;j<numVectors;j++)
	{
		btScalar maxDot(btScalar(-BT_LARGE_FLOAT));
		const btVector3& vec = vectors[j];

		btVector3 vtx;
		btScalar newDot;
		{
			btVector3 pos(0,0,0);
			pos[getUpAxis()] = getHalfHeight();
			vtx = pos +vec*(radius) - vec * getMargin();
			newDot = vec.dot(vtx);
			if (newDot > maxDot)
			{
				maxDot = newDot;
				supportVerticesOut[j] = vtx;
			}
		}
		{
			btVector3 pos(0,0,0);
			pos[getUpAxis()] = -getHalfHeight();
			vtx = pos +vec*(radius) - vec * getMargin();
			newDot = vec.dot(vtx);
			if (newDot > maxDot)
			{
				maxDot = newDot;
				supportVerticesOut[j] = vtx;
			}
		}
		
	}
}